

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O1

XML_Char * xlsxioread_sheet_next_cell(xlsxioreadersheet sheethandle)

{
  uint uVar1;
  XML_Char *pXVar2;
  size_t sVar3;
  XML_Status XVar4;
  ulong uVar5;
  char *pcVar6;
  
  while( true ) {
    if (sheethandle == (xlsxioreadersheet)0x0) {
      return (XML_Char *)0x0;
    }
    uVar1 = (sheethandle->processcallbackdata).flags;
    if ((((uVar1 & 2) == 0) && (sheethandle->paddingcol != 0)) ||
       (((uVar1 & 1) == 0 && (sheethandle->paddingrow != 0)))) break;
    if ((((uVar1 & 4) != 0) && (uVar5 = (sheethandle->processcallbackdata).cols, uVar5 != 0)) &&
       (uVar5 <= sheethandle->lastcolnr)) {
      return (XML_Char *)0x0;
    }
    if (((sheethandle->processcallbackdata).celldata == (XML_Char *)0x0) &&
       (XVar4 = expat_process_zip_file_resume
                          (sheethandle->zipfile,(sheethandle->processcallbackdata).xmlparser),
       XVar4 != XML_STATUS_SUSPENDED)) {
      (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
    }
    uVar1 = (sheethandle->processcallbackdata).flags;
    if (((uVar1 & 1) == 0) &&
       (uVar5 = sheethandle->lastrownr + 1, uVar5 < (sheethandle->processcallbackdata).rownr)) {
      sheethandle->paddingrow = uVar5;
      sheethandle->paddingcol = 1;
    }
    else {
      if (((uVar1 & 2) == 0) &&
         (uVar5 = sheethandle->lastcolnr + 1, uVar5 < (sheethandle->processcallbackdata).colnr)) {
        sheethandle->lastcolnr = uVar5;
        goto LAB_0010559e;
      }
      pXVar2 = (sheethandle->processcallbackdata).celldata;
      (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
      if (((pXVar2 != (XML_Char *)0x0) ||
          (sheethandle->lastrownr = (sheethandle->processcallbackdata).rownr, (uVar1 & 2) != 0)) ||
         ((sheethandle->processcallbackdata).cols <= (sheethandle->processcallbackdata).colnr)) {
        sheethandle->lastcolnr = (sheethandle->processcallbackdata).colnr;
        return pXVar2;
      }
      sheethandle->paddingcol = sheethandle->lastcolnr + 1;
    }
  }
  uVar5 = (sheethandle->processcallbackdata).cols;
  if ((uVar1 & 2) != 0 || uVar5 < sheethandle->paddingcol) {
    sheethandle->paddingcol = 0;
    sVar3 = sheethandle->paddingrow;
    if (sVar3 == 0) {
      return (XML_Char *)0x0;
    }
    sheethandle->lastrownr = sheethandle->lastrownr + 1;
    sheethandle->paddingrow = sVar3 + 1;
    if ((sheethandle->processcallbackdata).rownr <= sVar3 + 2) {
      return (XML_Char *)0x0;
    }
    sheethandle->paddingcol = 1;
    return (XML_Char *)0x0;
  }
  if ((uVar5 != 0 && (uVar1 & 4) != 0) && (uVar5 <= sheethandle->lastcolnr)) {
    return (XML_Char *)0x0;
  }
  sheethandle->paddingcol = sheethandle->paddingcol + 1;
  sheethandle->lastcolnr = sheethandle->lastcolnr + 1;
LAB_0010559e:
  pcVar6 = strdup("");
  return pcVar6;
}

Assistant:

DLL_EXPORT_XLSXIO XLSXIOCHAR* xlsxioread_sheet_next_cell (xlsxioreadersheet sheethandle)
{
  XML_Char* result;
  if (!sheethandle)
    return NULL;
  //if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->paddingcol) {
  if ((!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->paddingcol) || (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && sheethandle->paddingrow)) {
    if ((/*sheethandle->processcallbackdata.cols > 0 &&*/ sheethandle->paddingcol > sheethandle->processcallbackdata.cols) || (sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
      //last empty column added, finish row
      sheethandle->paddingcol = 0;
      //when padding rows prepare for the next one
      if (sheethandle->paddingrow) {
        sheethandle->lastrownr++;
        sheethandle->paddingrow++;
        if (sheethandle->paddingrow + 1 < sheethandle->processcallbackdata.rownr) {
          sheethandle->paddingcol = 1;
        }
      }
      return NULL;
    } else if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
      //end of line when out of bounds
      return NULL;
    } else {
      //add another empty column
      sheethandle->paddingcol++;
      sheethandle->lastcolnr++;
      return XML_Char_dup(X(""));
    }
  } else if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
    //end of line when out of bounds
    return NULL;
  }
  //get value
  if (!sheethandle->processcallbackdata.celldata)
    if (expat_process_zip_file_resume(sheethandle->zipfile, sheethandle->processcallbackdata.xmlparser) != XML_STATUS_SUSPENDED)
      sheethandle->processcallbackdata.celldata = NULL;
  //insert empty rows if needed
  if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && sheethandle->lastrownr + 1 < sheethandle->processcallbackdata.rownr) {
    sheethandle->paddingrow = sheethandle->lastrownr + 1;
    sheethandle->paddingcol = sheethandle->processcallbackdata.colnr*0 + 1;
    return xlsxioread_sheet_next_cell(sheethandle);
  }
  //insert empty column before if needed
  if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
    if (sheethandle->lastcolnr + 1 < sheethandle->processcallbackdata.colnr) {
      if (0) {
      //if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
        //end of line when out of bounds
        return NULL;
      } else {
        sheethandle->lastcolnr++;
        return XML_Char_dup(X(""));
      }
    }
  }
  result = sheethandle->processcallbackdata.celldata;
  sheethandle->processcallbackdata.celldata = NULL;
  //end of row
  if (!result) {
    sheethandle->lastrownr = sheethandle->processcallbackdata.rownr;
    //insert empty column at end of row if needed
    if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->processcallbackdata.colnr < sheethandle->processcallbackdata.cols) {
      sheethandle->paddingcol = sheethandle->lastcolnr + 1;
      return xlsxioread_sheet_next_cell(sheethandle);
    }
  }
  sheethandle->lastcolnr = sheethandle->processcallbackdata.colnr;
  return result;
}